

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryOptimizer.cpp
# Opt level: O3

Query * deduplicate_primitives(Query *__return_storage_ptr__,Query *q,bool *changed)

{
  _Rb_tree_header *p_Var1;
  pointer pQVar2;
  pointer pQVar3;
  Query *pQVar4;
  QueryType *pQVar5;
  vector<Query,_std::allocator<Query>_> *pvVar6;
  const_iterator cVar7;
  Query *query;
  pointer pQVar8;
  vector<Query,_std::allocator<Query>_> newqueries;
  set<PrimitiveQuery,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_> seen;
  vector<Query,_std::allocator<Query>_> local_d8;
  Query *local_c0;
  Query *local_b8;
  bool *local_b0;
  Query local_a8;
  _Rb_tree<PrimitiveQuery,_PrimitiveQuery,_std::_Identity<PrimitiveQuery>,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
  local_60;
  
  local_b0 = changed;
  pQVar5 = Query::get_type(q);
  if ((*pQVar5 != AND) && (pQVar5 = Query::get_type(q), *pQVar5 != OR)) {
    __return_storage_ptr__->type = q->type;
    pQVar3 = (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar3;
    (__return_storage_ptr__->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    __return_storage_ptr__->count = q->count;
    __return_storage_ptr__->ngram = q->ngram;
    pQVar8 = (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
             super__Vector_impl_data._M_finish;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_start =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_start;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_finish = pQVar8;
    (__return_storage_ptr__->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
         super__Vector_impl_data._M_end_of_storage;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    (q->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    return __return_storage_ptr__;
  }
  p_Var1 = &local_60._M_impl.super__Rb_tree_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_60._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_60._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_d8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_d8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_d8.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_c0 = __return_storage_ptr__;
  local_b8 = q;
  local_60._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  local_60._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pvVar6 = Query::as_queries(q);
  pQVar8 = (pvVar6->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pQVar2 = (pvVar6->super__Vector_base<Query,_std::allocator<Query>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (pQVar8 != pQVar2) {
    do {
      pQVar5 = Query::get_type(pQVar8);
      if (*pQVar5 == PRIMITIVE) {
        local_a8._0_8_ = Query::as_ngram(pQVar8);
        cVar7 = std::
                _Rb_tree<PrimitiveQuery,_PrimitiveQuery,_std::_Identity<PrimitiveQuery>,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
                ::find(&local_60,(key_type *)&local_a8);
        if ((_Rb_tree_header *)cVar7._M_node == p_Var1) {
          std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_d8,pQVar8);
          local_a8._0_8_ = Query::as_ngram(pQVar8);
          std::
          _Rb_tree<PrimitiveQuery,_PrimitiveQuery,_std::_Identity<PrimitiveQuery>,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
          ::_M_insert_unique<PrimitiveQuery>(&local_60,(key_type *)&local_a8);
        }
        else {
          *local_b0 = true;
        }
      }
      else {
        std::vector<Query,_std::allocator<Query>_>::emplace_back<Query>(&local_d8,pQVar8);
      }
      pQVar8 = pQVar8 + 1;
    } while (pQVar8 != pQVar2);
  }
  pQVar5 = Query::get_type(local_b8);
  Query::Query(&local_a8,pQVar5,&local_d8);
  pQVar4 = local_c0;
  local_c0->type = local_a8.type;
  (local_c0->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_start;
  (local_c0->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (local_c0->value).super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_a8.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_a8.value.super__Vector_base<QToken,_std::allocator<QToken>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  local_c0->count = local_a8.count;
  local_c0->ngram = local_a8.ngram;
  (local_c0->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_start =
       local_a8.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_start;
  (local_c0->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_finish =
       local_a8.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_finish;
  (local_c0->queries).super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       local_a8.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  local_a8.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
  ._M_end_of_storage = (pointer)0x0;
  local_a8.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
  ._M_start = (pointer)0x0;
  local_a8.queries.super__Vector_base<Query,_std::allocator<Query>_>._M_impl.super__Vector_impl_data
  ._M_finish = (pointer)0x0;
  std::vector<Query,_std::allocator<Query>_>::~vector
            ((vector<Query,_std::allocator<Query>_> *)&local_a8.queries);
  std::vector<QToken,_std::allocator<QToken>_>::~vector
            ((vector<QToken,_std::allocator<QToken>_> *)&local_a8.value);
  std::vector<Query,_std::allocator<Query>_>::~vector(&local_d8);
  std::
  _Rb_tree<PrimitiveQuery,_PrimitiveQuery,_std::_Identity<PrimitiveQuery>,_std::less<PrimitiveQuery>,_std::allocator<PrimitiveQuery>_>
  ::~_Rb_tree(&local_60);
  return pQVar4;
}

Assistant:

Query deduplicate_primitives(Query &&q, bool *changed) {
    if (q.get_type() != QueryType::AND && q.get_type() != QueryType::OR) {
        return std::move(q);
    }

    std::set<PrimitiveQuery> seen;
    std::vector<Query> newqueries;
    for (auto &&query : q.as_queries()) {
        if (query.get_type() != QueryType::PRIMITIVE) {
            newqueries.emplace_back(std::move(query));
        } else if (seen.count(query.as_ngram()) == 0) {
            newqueries.emplace_back(std::move(query));
            seen.insert(query.as_ngram());
        } else {
            *changed = true;
        }
    }
    return std::move(Query(q.get_type(), std::move(newqueries)));
}